

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O3

int mdb_env_open(MDB_env *env,char *path,uint flags,mdb_mode_t mode)

{
  int iVar1;
  size_t sVar2;
  MDB_IDL pMVar3;
  MDB_ID2L pMVar4;
  MDB_dbx *pMVar5;
  uint16_t *puVar6;
  uint *puVar7;
  void *pvVar8;
  MDB_txn *pMVar9;
  int *piVar10;
  int iVar11;
  MDB_txn **ppMVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  uint __oflag;
  char *pcVar16;
  int excl;
  int local_44;
  char *local_40;
  char *local_38;
  
  local_44 = -1;
  if ((flags & 0xfe00bffe) != 0) {
    return 0x16;
  }
  if (env->me_fd != -1) {
    return 0x16;
  }
  sVar2 = strlen(path);
  iVar1 = (int)sVar2;
  iVar11 = iVar1 * 2 + 7;
  if ((flags >> 0xe & 1) == 0) {
    iVar11 = iVar1 * 2 + 0x14;
  }
  local_40 = (char *)malloc((long)iVar11);
  if (local_40 == (char *)0x0) {
    return 0xc;
  }
  if ((flags >> 0xe & 1) == 0) {
    pcVar16 = local_40 + (long)iVar1 + 10;
    sprintf(local_40,"%s/lock.mdb",path);
    sprintf(pcVar16,"%s/data.mdb",path);
  }
  else {
    pcVar16 = local_40 + (long)iVar1 + 6;
    sprintf(local_40,"%s-lock",path);
    strcpy(pcVar16,path);
  }
  uVar13 = flags | env->me_flags;
  if ((uVar13 >> 0x11 & 1) == 0) {
    pMVar3 = mdb_midl_alloc(0x1ffff);
    env->me_free_pgs = pMVar3;
    if (pMVar3 != (MDB_IDL)0x0) {
      pMVar4 = (MDB_ID2L)calloc(0x20000,0x10);
      env->me_dirty_list = pMVar4;
      if (pMVar4 != (MDB_ID2L)0x0) goto LAB_0010e745;
    }
    env->me_flags = uVar13 | 0x20000000;
    iVar1 = 0xc;
  }
  else {
    uVar13 = uVar13 & 0xfff7ffff;
LAB_0010e745:
    env->me_flags = uVar13 | 0x20000000;
    local_38 = pcVar16;
    pcVar16 = strdup(path);
    env->me_path = pcVar16;
    uVar15 = (ulong)env->me_maxdbs;
    pMVar5 = (MDB_dbx *)calloc(uVar15,0x30);
    env->me_dbxs = pMVar5;
    puVar6 = (uint16_t *)calloc(uVar15,2);
    env->me_dbflags = puVar6;
    puVar7 = (uint *)calloc(uVar15,4);
    env->me_dbiseqs = puVar7;
    iVar11 = 0xc;
    iVar1 = iVar11;
    if ((pcVar16 != (char *)0x0 && pMVar5 != (MDB_dbx *)0x0) &&
       (puVar7 != (uint *)0x0 && puVar6 != (uint16_t *)0x0)) {
      pMVar5->md_cmp = mdb_cmp_long;
      if (((uVar13 & 0x420000) != 0) ||
         (iVar1 = mdb_env_setup_locks(env,local_40,mode,&local_44), iVar1 == 0)) {
        pcVar16 = local_38;
        __oflag = 0x42;
        if ((uVar13 >> 0x11 & 1) != 0) {
          __oflag = 0;
        }
        iVar1 = open(local_38,__oflag,(ulong)mode);
        env->me_fd = iVar1;
        if (iVar1 == -1) {
LAB_0010e969:
          piVar10 = __errno_location();
          iVar1 = *piVar10;
LAB_0010e970:
          if (iVar1 == 0) {
            iVar14 = 0;
            goto LAB_0010e982;
          }
        }
        else if ((((uVar13 & 0x420000) != 0x20000) ||
                 (iVar1 = mdb_env_setup_locks(env,local_40,mode,&local_44), iVar1 == 0)) &&
                (iVar1 = mdb_env_open2(env), iVar1 == 0)) {
          if ((uVar13 & 0xa0000) == 0) {
            iVar1 = open(pcVar16,__oflag & 2 | 0x1000,(ulong)mode);
            env->me_mfd = iVar1;
            if (iVar1 == -1) goto LAB_0010e969;
          }
          else {
            env->me_mfd = env->me_fd;
          }
          if ((0 < local_44) && (iVar1 = mdb_env_share_locks(env,&local_44), iVar1 != 0))
          goto LAB_0010e970;
          iVar14 = 0;
          if ((uVar13 >> 0x11 & 1) != 0) goto LAB_0010e982;
          uVar13 = env->me_maxdbs;
          uVar15 = (ulong)uVar13;
          pvVar8 = calloc(1,(ulong)env->me_psize);
          env->me_pbuf = pvVar8;
          iVar1 = iVar11;
          if ((pvVar8 != (void *)0x0) &&
             (pMVar9 = (MDB_txn *)calloc(1,(long)(int)(uVar13 * 0x3d + 0x88)),
             pMVar9 != (MDB_txn *)0x0)) {
            pMVar9->mt_dbs = (MDB_db *)(pMVar9 + 1);
            ppMVar12 = &pMVar9[1].mt_parent + uVar15 * 6;
            pMVar9->mt_cursors = (MDB_cursor **)ppMVar12;
            pMVar9->mt_dbiseqs = (uint *)(ppMVar12 + uVar15);
            pMVar9->mt_dbflags = (uchar *)((long)(ppMVar12 + uVar15) + uVar15 * 4);
            pMVar9->mt_env = env;
            pMVar9->mt_dbxs = env->me_dbxs;
            pMVar9->mt_flags = 1;
            env->me_txn0 = pMVar9;
            goto LAB_0010e982;
          }
        }
      }
    }
  }
  iVar14 = iVar1;
  mdb_env_close1(env);
LAB_0010e982:
  free(local_40);
  return iVar14;
}

Assistant:

int ESECT
mdb_env_open(MDB_env *env, const char *path, unsigned int flags, mdb_mode_t mode)
{
	int		oflags, rc, len, excl = -1;
	char *lpath, *dpath;
#ifdef _WIN32
	wchar_t *wpath;
#endif

	if (env->me_fd!=INVALID_HANDLE_VALUE || (flags & ~(CHANGEABLE|CHANGELESS)))
		return EINVAL;

#ifdef MDB_VL32
	if (flags & MDB_WRITEMAP) {
		/* silently ignore WRITEMAP in 32 bit mode */
		flags ^= MDB_WRITEMAP;
	}
	if (flags & MDB_FIXEDMAP) {
		/* cannot support FIXEDMAP */
		return EINVAL;
	}
#endif

	len = strlen(path);
	if (flags & MDB_NOSUBDIR) {
		rc = len + sizeof(LOCKSUFF) + len + 1;
	} else {
		rc = len + sizeof(LOCKNAME) + len + sizeof(DATANAME);
	}
	lpath = malloc(rc);
	if (!lpath)
		return ENOMEM;
	if (flags & MDB_NOSUBDIR) {
		dpath = lpath + len + sizeof(LOCKSUFF);
		sprintf(lpath, "%s" LOCKSUFF, path);
		strcpy(dpath, path);
	} else {
		dpath = lpath + len + sizeof(LOCKNAME);
		sprintf(lpath, "%s" LOCKNAME, path);
		sprintf(dpath, "%s" DATANAME, path);
	}

	rc = MDB_SUCCESS;
	flags |= env->me_flags;
	if (flags & MDB_RDONLY) {
		/* silently ignore WRITEMAP when we're only getting read access */
		flags &= ~MDB_WRITEMAP;
	} else {
		if (!((env->me_free_pgs = mdb_midl_alloc(MDB_IDL_UM_MAX)) &&
			  (env->me_dirty_list = calloc(MDB_IDL_UM_SIZE, sizeof(MDB_ID2)))))
			rc = ENOMEM;
	}
#ifdef MDB_VL32
	if (!rc) {
		env->me_rpages = malloc(MDB_ERPAGE_SIZE * sizeof(MDB_ID3));
		if (!env->me_rpages) {
			rc = ENOMEM;
			goto leave;
		}
		env->me_rpages[0].mid = 0;
		env->me_rpcheck = MDB_ERPAGE_SIZE/2;
	}
#endif
	env->me_flags = flags |= MDB_ENV_ACTIVE;
	if (rc)
		goto leave;

	env->me_path = strdup(path);
	env->me_dbxs = calloc(env->me_maxdbs, sizeof(MDB_dbx));
	env->me_dbflags = calloc(env->me_maxdbs, sizeof(uint16_t));
	env->me_dbiseqs = calloc(env->me_maxdbs, sizeof(unsigned int));
	if (!(env->me_dbxs && env->me_path && env->me_dbflags && env->me_dbiseqs)) {
		rc = ENOMEM;
		goto leave;
	}
	env->me_dbxs[FREE_DBI].md_cmp = mdb_cmp_long; /* aligned MDB_INTEGERKEY */

	/* For RDONLY, get lockfile after we know datafile exists */
	if (!(flags & (MDB_RDONLY|MDB_NOLOCK))) {
		rc = mdb_env_setup_locks(env, lpath, mode, &excl);
		if (rc)
			goto leave;
	}

#ifdef _WIN32
	if (F_ISSET(flags, MDB_RDONLY)) {
		oflags = GENERIC_READ;
		len = OPEN_EXISTING;
	} else {
		oflags = GENERIC_READ|GENERIC_WRITE;
		len = OPEN_ALWAYS;
	}
	mode = FILE_ATTRIBUTE_NORMAL;
	rc = utf8_to_utf16(dpath, -1, &wpath, NULL);
	if (rc)
		goto leave;
	env->me_fd = CreateFileW(wpath, oflags, FILE_SHARE_READ|FILE_SHARE_WRITE,
		NULL, len, mode, NULL);
	free(wpath);
#else
	if (F_ISSET(flags, MDB_RDONLY))
		oflags = O_RDONLY;
	else
		oflags = O_RDWR | O_CREAT;

	env->me_fd = open(dpath, oflags, mode);
#endif
	if (env->me_fd == INVALID_HANDLE_VALUE) {
		rc = ErrCode();
		goto leave;
	}

	if ((flags & (MDB_RDONLY|MDB_NOLOCK)) == MDB_RDONLY) {
		rc = mdb_env_setup_locks(env, lpath, mode, &excl);
		if (rc)
			goto leave;
	}

	if ((rc = mdb_env_open2(env)) == MDB_SUCCESS) {
		if (flags & (MDB_RDONLY|MDB_WRITEMAP)) {
			env->me_mfd = env->me_fd;
		} else {
			/* Synchronous fd for meta writes. Needed even with
			 * MDB_NOSYNC/MDB_NOMETASYNC, in case these get reset.
			 */
#ifdef _WIN32
			len = OPEN_EXISTING;
			rc = utf8_to_utf16(dpath, -1, &wpath, NULL);
			if (rc)
				goto leave;
			env->me_mfd = CreateFileW(wpath, oflags,
				FILE_SHARE_READ|FILE_SHARE_WRITE, NULL, len,
				mode | FILE_FLAG_WRITE_THROUGH, NULL);
			free(wpath);
#else
			oflags &= ~O_CREAT;
			env->me_mfd = open(dpath, oflags | MDB_DSYNC, mode);
#endif
			if (env->me_mfd == INVALID_HANDLE_VALUE) {
				rc = ErrCode();
				goto leave;
			}
		}
		DPRINTF(("opened dbenv %p", (void *) env));
		if (excl > 0) {
			rc = mdb_env_share_locks(env, &excl);
			if (rc)
				goto leave;
		}
		if (!(flags & MDB_RDONLY)) {
			MDB_txn *txn;
			int tsize = sizeof(MDB_txn), size = tsize + env->me_maxdbs *
				(sizeof(MDB_db)+sizeof(MDB_cursor *)+sizeof(unsigned int)+1);
			if ((env->me_pbuf = calloc(1, env->me_psize)) &&
				(txn = calloc(1, size)))
			{
				txn->mt_dbs = (MDB_db *)((char *)txn + tsize);
				txn->mt_cursors = (MDB_cursor **)(txn->mt_dbs + env->me_maxdbs);
				txn->mt_dbiseqs = (unsigned int *)(txn->mt_cursors + env->me_maxdbs);
				txn->mt_dbflags = (unsigned char *)(txn->mt_dbiseqs + env->me_maxdbs);
				txn->mt_env = env;
#ifdef MDB_VL32
				txn->mt_rpages = malloc(MDB_TRPAGE_SIZE * sizeof(MDB_ID3));
				if (!txn->mt_rpages) {
					free(txn);
					rc = ENOMEM;
					goto leave;
				}
				txn->mt_rpages[0].mid = 0;
				txn->mt_rpcheck = MDB_TRPAGE_SIZE/2;
#endif
				txn->mt_dbxs = env->me_dbxs;
				txn->mt_flags = MDB_TXN_FINISHED;
				env->me_txn0 = txn;
			} else {
				rc = ENOMEM;
			}
		}
	}

leave:
	if (rc) {
		mdb_env_close0(env, excl);
	}
	free(lpath);
	return rc;
}